

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPrint.c
# Opt level: O0

void Fxu_MatrixPrint(FILE *pFile,Fxu_Matrix *p)

{
  long lVar1;
  int local_50;
  int fStdout;
  int LastNum;
  int i;
  Fxu_Pair *pPair;
  Fxu_Lit *pLit;
  Fxu_Single *pSingle;
  Fxu_Double *pDiv;
  Fxu_Cube *pCube;
  Fxu_Var *pVar;
  Fxu_Matrix *p_local;
  FILE *pFile_local;
  
  p_local = (Fxu_Matrix *)pFile;
  if (pFile == (FILE *)0x0) {
    p_local = (Fxu_Matrix *)fopen("matrix.txt","w");
  }
  fprintf((FILE *)p_local,"Matrix has %d vars, %d cubes, %d literals, %d divisors.\n",
          (ulong)(uint)(p->lVars).nItems,(ulong)(uint)(p->lCubes).nItems,(ulong)(uint)p->nEntries,
          (ulong)(uint)p->nDivs);
  fprintf((FILE *)p_local,"Divisors selected so far: single = %d, double = %d.\n",
          (ulong)(uint)p->nDivs1,(ulong)(uint)p->nDivs2);
  fprintf((FILE *)p_local,"\n");
  for (fStdout = 0; fStdout < 0xc; fStdout = fStdout + 1) {
    fprintf((FILE *)p_local," ");
  }
  for (pCube = (Fxu_Cube *)(p->lVars).pHead; pCube != (Fxu_Cube *)0x0; pCube = pCube->pNext) {
    fprintf((FILE *)p_local,"%d",(long)pCube->iCube % 10 & 0xffffffff);
  }
  fprintf((FILE *)p_local,"\n");
  for (pDiv = (Fxu_Double *)(p->lCubes).pHead; pDiv != (Fxu_Double *)0x0; pDiv = pDiv->pOrder) {
    fprintf((FILE *)p_local,"%4d",(ulong)(uint)pDiv->Num);
    fprintf((FILE *)p_local,"  ");
    fprintf((FILE *)p_local,"%4d",(ulong)(uint)((pDiv->lPairs).pHead)->nLits1);
    fprintf((FILE *)p_local,"  ");
    local_50 = -1;
    for (pPair = (pDiv->lPairs).pTail; fStdout = local_50, pPair != (Fxu_Pair *)0x0;
        pPair = (Fxu_Pair *)pPair->pCube2) {
      while (fStdout = fStdout + 1, fStdout < pPair->pDiv->Num) {
        fprintf((FILE *)p_local,".");
      }
      fprintf((FILE *)p_local,"1");
      local_50 = fStdout;
    }
    while (fStdout = fStdout + 1, fStdout < (p->lVars).nItems) {
      fprintf((FILE *)p_local,".");
    }
    fprintf((FILE *)p_local,"\n");
  }
  fprintf((FILE *)p_local,"\n");
  fprintf((FILE *)p_local,"The double divisors are:\n");
  for (fStdout = 0; fStdout < p->nTableSize; fStdout = fStdout + 1) {
    for (pSingle = (Fxu_Single *)p->pTable[fStdout].pHead; pSingle != (Fxu_Single *)0x0;
        pSingle = *(Fxu_Single **)(pSingle + 1)) {
      fprintf((FILE *)p_local,"Divisor #%3d (lit=%d,%d) (w=%2d):  ",(ulong)(uint)pSingle->Num,
              (ulong)(uint)pSingle->pVar1->iVar,(ulong)(uint)pSingle->pVar1->nCubes,
              (ulong)(uint)pSingle->Weight);
      for (_LastNum = pSingle->pVar1; _LastNum != (Fxu_Var *)0x0; _LastNum = _LastNum->pNext) {
        fprintf((FILE *)p_local," <%d, %d> (b=%d)",(ulong)(uint)((_LastNum->lLits).pHead)->iVar,
                (ulong)(uint)((_LastNum->lLits).pTail)->iVar,(ulong)*(uint *)&_LastNum->pFirst);
      }
      fprintf((FILE *)p_local,"\n");
    }
  }
  fprintf((FILE *)p_local,"\n");
  fprintf((FILE *)p_local,"The cubes are:\n");
  for (pDiv = (Fxu_Double *)(p->lCubes).pHead; pDiv != (Fxu_Double *)0x0; pDiv = pDiv->pOrder) {
    fprintf((FILE *)p_local,"Cube #%3d: ",(ulong)(uint)pDiv->Num);
    if (((pDiv->lPairs).pHead)->pDiv != (Fxu_Double *)0x0) {
      for (fStdout = 0; fStdout < ((pDiv->lPairs).pHead)->nLits2; fStdout = fStdout + 1) {
        lVar1 = *(long *)(*(long *)(&((pDiv->lPairs).pHead)->pDiv->Num + (long)pDiv->Num * 2) +
                         (long)fStdout * 8);
        if (lVar1 != 0) {
          fprintf((FILE *)p_local," <%d %d> (d=%d) (b=%d)",(ulong)*(uint *)(lVar1 + 0x28),
                  (ulong)*(uint *)(lVar1 + 0x2c),(ulong)**(uint **)(lVar1 + 0x10),
                  (ulong)*(uint *)(lVar1 + 8));
        }
      }
    }
    fprintf((FILE *)p_local,"\n");
  }
  fprintf((FILE *)p_local,"\n");
  fprintf((FILE *)p_local,"The single divisors are:\n");
  for (pLit = (Fxu_Lit *)(p->lSingles).pHead; pLit != (Fxu_Lit *)0x0; pLit = pLit->pVPrev) {
    fprintf((FILE *)p_local,"Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n",
            (ulong)(uint)pLit->iVar,(ulong)(uint)pLit->pVar->iVar,(ulong)(uint)pLit->pHPrev->iVar,
            (ulong)*(uint *)&pLit->pCube);
  }
  fprintf((FILE *)p_local,"\n");
  if (pFile == (FILE *)0x0) {
    fclose((FILE *)p_local);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fxu_MatrixPrint( FILE * pFile, Fxu_Matrix * p )
{
	Fxu_Var * pVar;
	Fxu_Cube * pCube;
	Fxu_Double * pDiv;
    Fxu_Single * pSingle;
	Fxu_Lit * pLit;
	Fxu_Pair * pPair;
	int i, LastNum;
	int fStdout;

	fStdout = 1;
	if ( pFile == NULL )
	{
		pFile = fopen( "matrix.txt", "w" );
		fStdout = 0;
	}

	fprintf( pFile, "Matrix has %d vars, %d cubes, %d literals, %d divisors.\n", 
		p->lVars.nItems, p->lCubes.nItems, p->nEntries, p->nDivs );
	fprintf( pFile, "Divisors selected so far: single = %d, double = %d.\n", 
		p->nDivs1, p->nDivs2 );
	fprintf( pFile, "\n" );

	// print the numbers on top of the matrix
	for ( i = 0; i < 12; i++ )
		fprintf( pFile, " " );
	Fxu_MatrixForEachVariable( p, pVar )
		fprintf( pFile, "%d", pVar->iVar % 10 );
	fprintf( pFile, "\n" );

	// print the rows
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "%4d", pCube->iCube );
		fprintf( pFile, "  " );
		fprintf( pFile, "%4d", pCube->pVar->iVar );
		fprintf( pFile, "  " );

		// print the literals
		LastNum = -1;
		Fxu_CubeForEachLiteral( pCube, pLit )
		{
			for ( i = LastNum + 1; i < pLit->pVar->iVar; i++ )
				fprintf( pFile, "." );
			fprintf( pFile, "1" );
			LastNum = i;
		}
		for ( i = LastNum + 1; i < p->lVars.nItems; i++ )
			fprintf( pFile, "." );
		fprintf( pFile, "\n" );
	}
	fprintf( pFile, "\n" );

	// print the double-cube divisors
	fprintf( pFile, "The double divisors are:\n" );
	Fxu_MatrixForEachDouble( p, pDiv, i )
	{
		fprintf( pFile, "Divisor #%3d (lit=%d,%d) (w=%2d):  ", 
			pDiv->Num, pDiv->lPairs.pHead->nLits1, 
            pDiv->lPairs.pHead->nLits2, pDiv->Weight );
		Fxu_DoubleForEachPair( pDiv, pPair )
			fprintf( pFile, " <%d, %d> (b=%d)", 
				pPair->pCube1->iCube, pPair->pCube2->iCube, pPair->nBase );
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the divisors associated with each cube
	fprintf( pFile, "The cubes are:\n" );
	Fxu_MatrixForEachCube( p, pCube )
	{
		fprintf( pFile, "Cube #%3d: ", pCube->iCube );
        if ( pCube->pVar->ppPairs )
        {
		    Fxu_CubeForEachPair( pCube, pPair, i )
				fprintf( pFile, " <%d %d> (d=%d) (b=%d)", 
					pPair->iCube1, pPair->iCube2, pPair->pDiv->Num, pPair->nBase );
        }
		fprintf( pFile, "\n" );
	}
    fprintf( pFile, "\n" );

	// print the single-cube divisors
	fprintf( pFile, "The single divisors are:\n" );
	Fxu_MatrixForEachSingle( p, pSingle )
	{
		fprintf( pFile, "Single-cube divisor #%5d: Var1 = %4d. Var2 = %4d. Weight = %2d\n", 
			pSingle->Num, pSingle->pVar1->iVar, pSingle->pVar2->iVar, pSingle->Weight );
	}
    fprintf( pFile, "\n" );

/*
    {
        int Index;
		fprintf( pFile, "Distribution of divisors in the hash table:\n" );
        for ( Index = 0; Index < p->nTableSize; Index++ )
            fprintf( pFile, " %d", p->pTable[Index].nItems );
		fprintf( pFile, "\n" );
    }
*/
	if ( !fStdout )
		fclose( pFile );
}